

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall mario::TcpServer::removeConnectionInLoop(TcpServer *this,TcpConnectionPtr *conn)

{
  element_type *peVar1;
  EventLoop *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Writer *pWVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>_>
  pVar4;
  undefined1 local_98 [16];
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  LineNumber local_78;
  char *local_70;
  VerboseLevel local_68;
  Logger *local_60;
  bool local_58;
  Logger *local_50;
  char *local_48;
  DispatchAction local_40;
  pointer local_38;
  pointer pbStack_30;
  pointer local_28;
  
  EventLoop::assertInLoopThread(this->_loop);
  local_98._0_8_ = &PTR__Writer_00134af0;
  local_98._8_8_ = (LogMessage *)0x0;
  local_88 = (_Manager_type)CONCAT44(local_88._4_4_,Info);
  p_Stack_80 = (_Invoker_type)0x124eb4;
  local_78 = 0x52;
  local_70 = "void mario::TcpServer::removeConnectionInLoop(const TcpConnectionPtr &)";
  local_68 = 0;
  local_60 = (Logger *)0x0;
  local_58 = false;
  local_50 = (Logger *)0x0;
  local_48 = "";
  local_40 = NormalLog;
  local_38 = (pointer)0x0;
  pbStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  pWVar3 = el::base::Writer::construct((Writer *)local_98,1,"default");
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<
              (&pWVar3->m_messageBuilder,"TcpServer::removeConnectionInLoop [");
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,(this->_name)._M_dataplus._M_p);
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"] - connection ");
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<
              (&pWVar3->m_messageBuilder,
               (((conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->_name)._M_dataplus._M_p);
  }
  el::base::Writer::~Writer((Writer *)local_98);
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>_>
          ::equal_range(&(this->_connections)._M_t,
                        &((conn->
                          super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>_>
  ::_M_erase_aux(&(this->_connections)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  peVar1 = (conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = peVar1->_loop;
  p_Var2 = (conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_88 = (_Manager_type)0x0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_98._0_8_ = (_func_int **)0x0;
  local_98._8_8_ = (LogMessage *)0x0;
  local_98._0_8_ = operator_new(0x20);
  *(code **)local_98._0_8_ = TcpConnection::connectDestroyed;
  *(_func_int **)(local_98._0_8_ + 8) = (_func_int *)0x0;
  *(element_type **)(local_98._0_8_ + 0x10) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98._0_8_ + 0x18) = p_Var2;
  p_Stack_80 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>_>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>_>
             ::_M_manager;
  EventLoop::queueInLoop(this_00,(Functor *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  return;
}

Assistant:

void TcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    LOG(INFO) << "TcpServer::removeConnectionInLoop [" << _name << "] - connection " << conn->name();
    _connections.erase(conn->name());
    EventLoop* ioLoop = conn->getLoop();
    ioLoop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
}